

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  uint uVar1;
  
  while (uVar1 = (byte)(this->field_0).json_const_pointer_ & 0xf, uVar1 - 8 < 2) {
    this = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
            ((long)&this->field_0 + 8);
  }
  if ((uVar1 != 7) && (uVar1 != 0xf)) {
    return false;
  }
  return true;
}

Assistant:

bool is_string() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return true;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_string();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_string();
                default:
                    return false;
            }
        }